

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_type_(lysc_ctx *ctx,lysp_node *context_pnode,uint16_t context_flags,
                        char *context_name,lysp_type *type_p,LY_DATA_TYPE basetype,char *tpdfname,
                        lysc_type *base,lyplg_type *plugin,ly_set *tpdf_chain,
                        uint32_t tpdf_chain_last,lysc_type **type)

{
  int *piVar1;
  long lVar2;
  ly_ctx *ctx_00;
  char **ppcVar3;
  LY_ERR LVar4;
  lysc_ext_instance *plVar5;
  uint64_t uVar6;
  char *pcVar7;
  lysc_range *plVar8;
  lysc_pattern **pplVar9;
  lysc_type_identityref *plVar10;
  long *plVar11;
  size_t value_len;
  void *local_5d0;
  lysp_ext_instance *local_5b0;
  lysp_ext_instance *local_5a0;
  lysp_ext_instance *local_588;
  lysp_ext_instance *local_578;
  void *local_558;
  void *local_550;
  void *local_548;
  char *local_528;
  long local_518;
  long local_500;
  long local_4f0;
  void *local_4d0;
  void *local_4c8;
  char *local_4c0;
  long local_4b0;
  long local_4a0;
  long local_498;
  char *local_470;
  long local_460;
  long local_450;
  long local_448;
  void *local_430;
  lysp_ext_instance *local_410;
  lysp_ext_instance *local_400;
  lysp_ext_instance *local_3e8;
  lysp_ext_instance *local_3d8;
  char *local_3b8;
  char *local_3b0;
  lysc_range *local_3a8;
  lysc_type_bitenum_item *local_388;
  lysc_ext_instance *local_368;
  long local_350;
  lysp_ext_instance *local_330;
  lysp_ext_instance *local_320;
  lysp_ext_instance *local_308;
  lysp_ext_instance *local_2f8;
  char *local_2d8;
  char *local_2d0;
  lysc_range *local_2c8;
  long local_2a8;
  lysp_ext_instance *local_288;
  lysp_ext_instance *local_278;
  lysp_ext_instance *local_260;
  lysp_ext_instance *local_250;
  char *local_230;
  char *local_228;
  lysc_ext_instance *local_220;
  lysc_type_bitenum_item *local_200;
  void *local_1e0;
  lysp_ext_instance *local_1c0;
  lysp_ext_instance *local_1b0;
  lysp_ext_instance *local_198;
  lysp_ext_instance *local_188;
  char *local_168;
  char *local_160;
  lysc_range *local_158;
  long *local_130;
  char *p___7;
  uint64_t __u_5;
  char *p___6;
  uint64_t __u_4;
  char *p___5;
  uint64_t u_1;
  lysc_type_union *un_base;
  long *plStack_f0;
  LY_VALUE_FORMAT format;
  char *p___4;
  uint64_t u;
  lysc_type_identityref *idref_base;
  char *p___3;
  uint64_t __u_3;
  char *p___2;
  uint64_t __u_2;
  char *p___1;
  uint64_t __u_1;
  char *p__;
  uint64_t __u;
  char *pcStack_90;
  uint32_t i;
  lysp_type *base_type_p;
  lys_type_item *tpdf_item;
  lysc_type_union *un;
  lysc_type_leafref *lref;
  lysc_type_identityref *idref;
  lysc_type_dec *dec;
  lysc_type_enum *enumeration;
  lysc_type_bits *bits;
  lysc_type_str *str;
  lysc_type_num *num;
  lysc_type_bin *bin;
  LY_ERR rc;
  LY_DATA_TYPE basetype_local;
  lysp_type *type_p_local;
  char *context_name_local;
  lysp_node *plStack_18;
  uint16_t context_flags_local;
  lysp_node *context_pnode_local;
  lysc_ctx *ctx_local;
  
  bin._0_4_ = 0;
  bin._4_4_ = basetype;
  _rc = type_p;
  type_p_local = (lysp_type *)context_name;
  context_name_local._6_2_ = context_flags;
  plStack_18 = context_pnode;
  context_pnode_local = (lysp_node *)ctx;
  bin._0_4_ = lys_new_type(ctx->ctx,basetype,tpdfname,type);
  if ((LY_ERR)bin != LY_SUCCESS) goto LAB_00170587;
  (*type)->basetype = bin._4_4_;
  (*type)->plugin = plugin;
  switch(bin._4_4_) {
  case LY_TYPE_UNKNOWN:
  case LY_TYPE_BOOL:
  case LY_TYPE_EMPTY:
    break;
  case LY_TYPE_BINARY:
    num = (lysc_type_num *)*type;
    if (_rc->length != (lysp_restr *)0x0) {
      if (base == (lysc_type *)0x0) {
        local_158 = (lysc_range *)0x0;
      }
      else {
        local_158 = (lysc_range *)base[1].name;
      }
      bin._0_4_ = lys_compile_type_range
                            ((lysc_ctx *)context_pnode_local,_rc->length,bin._4_4_,'\x01','\0',
                             local_158,&num->range);
      if ((LY_ERR)bin != LY_SUCCESS) goto LAB_00170587;
      if ((tpdfname == (char *)0x0) && (_rc->length->exts != (lysp_ext_instance *)0x0)) {
        if (num->range->exts == (lysc_ext_instance *)0x0) {
          local_168 = (char *)0x0;
        }
        else {
          if (num->range->exts == (lysc_ext_instance *)0x0) {
            local_160 = (char *)0x0;
          }
          else {
            local_160 = (char *)num->range->exts[-1].compiled;
          }
          local_168 = local_160;
        }
        p__ = local_168;
        if (num->range->exts == (lysc_ext_instance *)0x0) {
          if (_rc->length->exts == (lysp_ext_instance *)0x0) {
            local_198 = (lysp_ext_instance *)0x0;
          }
          else {
            local_198 = _rc->length->exts[-1].exts;
          }
          __u_1 = (uint64_t)calloc(1,(long)(local_168 + (long)local_198) * 0x48 + 8);
          if ((void *)__u_1 != (void *)0x0) goto LAB_0016dad6;
          ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).","lys_compile_type_");
          bin._0_4_ = LY_EMEM;
        }
        else {
          if (_rc->length->exts == (lysp_ext_instance *)0x0) {
            local_188 = (lysp_ext_instance *)0x0;
          }
          else {
            local_188 = _rc->length->exts[-1].exts;
          }
          __u_1 = (uint64_t)
                  realloc(&num->range->exts[-1].compiled,
                          (long)((long)num->range->exts[-1].compiled +
                                (long)(local_168 + (long)local_188)) * 0x48 + 8);
          if ((void *)__u_1 != (void *)0x0) {
LAB_0016dad6:
            plVar5 = (lysc_ext_instance *)(__u_1 + 8);
            num->range->exts = plVar5;
            if (num->range->exts != (lysc_ext_instance *)0x0) {
              lVar2 = *(long *)__u_1;
              if (_rc->length->exts == (lysp_ext_instance *)0x0) {
                local_1b0 = (lysp_ext_instance *)0x0;
              }
              else {
                local_1b0 = _rc->length->exts[-1].exts;
              }
              __u_1 = (uint64_t)plVar5;
              memset(num->range->exts + lVar2,0,(long)(p__ + (long)local_1b0) * 0x48);
              plVar5 = (lysc_ext_instance *)__u_1;
            }
            __u_1 = (uint64_t)plVar5;
            p__ = (char *)0x0;
            do {
              if (_rc->length->exts == (lysp_ext_instance *)0x0) {
                local_1c0 = (lysp_ext_instance *)0x0;
              }
              else {
                local_1c0 = _rc->length->exts[-1].exts;
              }
              if (local_1c0 <= p__) goto switchD_0016d80e_default;
              plVar5 = num->range->exts;
              plVar5[-1].compiled = (void *)((long)plVar5[-1].compiled + 1);
              if (num->range->exts == (lysc_ext_instance *)0x0) {
                local_1e0 = (void *)0x0;
              }
              else {
                local_1e0 = num->range->exts[-1].compiled;
              }
              bin._0_4_ = lys_compile_ext((lysc_ctx *)context_pnode_local,
                                          _rc->length->exts + (long)p__,
                                          num->range->exts + (long)local_1e0 + -1,num->range);
              if ((LY_ERR)bin == LY_ENOT) {
                plVar5 = num->range->exts;
                plVar5[-1].compiled = (void *)((long)plVar5[-1].compiled + -1);
                bin._0_4_ = LY_SUCCESS;
              }
              else if ((LY_ERR)bin != LY_SUCCESS) goto LAB_00170587;
              p__ = p__ + 1;
            } while( true );
          }
          ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).","lys_compile_type_");
          bin._0_4_ = LY_EMEM;
        }
        goto LAB_00170587;
      }
    }
    break;
  case LY_TYPE_UINT8:
  case LY_TYPE_UINT16:
  case LY_TYPE_UINT32:
  case LY_TYPE_UINT64:
  case LY_TYPE_INT8:
  case LY_TYPE_INT16:
  case LY_TYPE_INT32:
  case LY_TYPE_INT64:
    str = (lysc_type_str *)*type;
    if (_rc->range != (lysp_restr *)0x0) {
      if (base == (lysc_type *)0x0) {
        local_3a8 = (lysc_range *)0x0;
      }
      else {
        local_3a8 = (lysc_range *)base[1].name;
      }
      bin._0_4_ = lys_compile_type_range
                            ((lysc_ctx *)context_pnode_local,_rc->range,bin._4_4_,'\0','\0',
                             local_3a8,&str->length);
      if ((LY_ERR)bin != LY_SUCCESS) goto LAB_00170587;
      if ((tpdfname == (char *)0x0) && (_rc->range->exts != (lysp_ext_instance *)0x0)) {
        if (str->length->exts == (lysc_ext_instance *)0x0) {
          local_3b8 = (char *)0x0;
        }
        else {
          if (str->length->exts == (lysc_ext_instance *)0x0) {
            local_3b0 = (char *)0x0;
          }
          else {
            local_3b0 = (char *)str->length->exts[-1].compiled;
          }
          local_3b8 = local_3b0;
        }
        p___3 = local_3b8;
        if (str->length->exts == (lysc_ext_instance *)0x0) {
          if (_rc->range->exts == (lysp_ext_instance *)0x0) {
            local_3e8 = (lysp_ext_instance *)0x0;
          }
          else {
            local_3e8 = _rc->range->exts[-1].exts;
          }
          idref_base = (lysc_type_identityref *)
                       calloc(1,(long)(local_3b8 + (long)local_3e8) * 0x48 + 8);
          if (idref_base != (lysc_type_identityref *)0x0) goto LAB_0016f020;
          ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).","lys_compile_type_");
          bin._0_4_ = LY_EMEM;
        }
        else {
          if (_rc->range->exts == (lysp_ext_instance *)0x0) {
            local_3d8 = (lysp_ext_instance *)0x0;
          }
          else {
            local_3d8 = _rc->range->exts[-1].exts;
          }
          idref_base = (lysc_type_identityref *)
                       realloc(&str->length->exts[-1].compiled,
                               (long)((long)str->length->exts[-1].compiled +
                                     (long)(local_3b8 + (long)local_3d8)) * 0x48 + 8);
          if (idref_base != (lysc_type_identityref *)0x0) {
LAB_0016f020:
            plVar10 = (lysc_type_identityref *)&idref_base->exts;
            str->length->exts = (lysc_ext_instance *)plVar10;
            if (str->length->exts != (lysc_ext_instance *)0x0) {
              ppcVar3 = &idref_base->name;
              if (_rc->range->exts == (lysp_ext_instance *)0x0) {
                local_400 = (lysp_ext_instance *)0x0;
              }
              else {
                local_400 = _rc->range->exts[-1].exts;
              }
              idref_base = plVar10;
              memset(str->length->exts + (long)*ppcVar3,0,(long)(p___3 + (long)local_400) * 0x48);
              plVar10 = idref_base;
            }
            idref_base = plVar10;
            p___3 = (char *)0x0;
            do {
              if (_rc->range->exts == (lysp_ext_instance *)0x0) {
                local_410 = (lysp_ext_instance *)0x0;
              }
              else {
                local_410 = _rc->range->exts[-1].exts;
              }
              if (local_410 <= p___3) goto switchD_0016d80e_default;
              plVar5 = str->length->exts;
              plVar5[-1].compiled = (void *)((long)plVar5[-1].compiled + 1);
              if (str->length->exts == (lysc_ext_instance *)0x0) {
                local_430 = (void *)0x0;
              }
              else {
                local_430 = str->length->exts[-1].compiled;
              }
              bin._0_4_ = lys_compile_ext((lysc_ctx *)context_pnode_local,
                                          _rc->range->exts + (long)p___3,
                                          str->length->exts + (long)local_430 + -1,str->length);
              if ((LY_ERR)bin == LY_ENOT) {
                plVar5 = str->length->exts;
                plVar5[-1].compiled = (void *)((long)plVar5[-1].compiled + -1);
                bin._0_4_ = LY_SUCCESS;
              }
              else if ((LY_ERR)bin != LY_SUCCESS) goto LAB_00170587;
              p___3 = p___3 + 1;
            } while( true );
          }
          ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).","lys_compile_type_");
          bin._0_4_ = LY_EMEM;
        }
        goto LAB_00170587;
      }
    }
    break;
  case LY_TYPE_STRING:
    bits = (lysc_type_bits *)*type;
    if (_rc->length == (lysp_restr *)0x0) {
      if ((base != (lysc_type *)0x0) && (base[1].name != (char *)0x0)) {
        plVar8 = lysc_range_dup((lysc_ctx *)context_pnode_local,(lysc_range *)base[1].name,
                                tpdf_chain,tpdf_chain_last);
        bits->bits = (lysc_type_bitenum_item *)plVar8;
      }
    }
    else {
      if (base == (lysc_type *)0x0) {
        local_2c8 = (lysc_range *)0x0;
      }
      else {
        local_2c8 = (lysc_range *)base[1].name;
      }
      bin._0_4_ = lys_compile_type_range
                            ((lysc_ctx *)context_pnode_local,_rc->length,bin._4_4_,'\x01','\0',
                             local_2c8,(lysc_range **)&bits->bits);
      if ((LY_ERR)bin != LY_SUCCESS) goto LAB_00170587;
      if ((tpdfname == (char *)0x0) && (_rc->length->exts != (lysp_ext_instance *)0x0)) {
        if (bits->bits[1].name == (char *)0x0) {
          local_2d8 = (char *)0x0;
        }
        else {
          if (bits->bits[1].name == (char *)0x0) {
            local_2d0 = (char *)0x0;
          }
          else {
            local_2d0 = *(char **)(bits->bits[1].name + -8);
          }
          local_2d8 = local_2d0;
        }
        p___2 = local_2d8;
        if (bits->bits[1].name == (char *)0x0) {
          if (_rc->length->exts == (lysp_ext_instance *)0x0) {
            local_308 = (lysp_ext_instance *)0x0;
          }
          else {
            local_308 = _rc->length->exts[-1].exts;
          }
          __u_3 = (uint64_t)calloc(1,(long)(local_2d8 + (long)local_308) * 0x48 + 8);
          if ((void *)__u_3 != (void *)0x0) goto LAB_0016e81d;
          ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).","lys_compile_type_");
          bin._0_4_ = LY_EMEM;
        }
        else {
          if (_rc->length->exts == (lysp_ext_instance *)0x0) {
            local_2f8 = (lysp_ext_instance *)0x0;
          }
          else {
            local_2f8 = _rc->length->exts[-1].exts;
          }
          __u_3 = (uint64_t)
                  realloc(bits->bits[1].name + -8,
                          (long)(local_2d8 + (long)local_2f8 + *(long *)(bits->bits[1].name + -8)) *
                          0x48 + 8);
          if ((void *)__u_3 != (void *)0x0) {
LAB_0016e81d:
            pcVar7 = (char *)(__u_3 + 8);
            bits->bits[1].name = pcVar7;
            if (bits->bits[1].name != (char *)0x0) {
              lVar2 = *(long *)__u_3;
              if (_rc->length->exts == (lysp_ext_instance *)0x0) {
                local_320 = (lysp_ext_instance *)0x0;
              }
              else {
                local_320 = _rc->length->exts[-1].exts;
              }
              __u_3 = (uint64_t)pcVar7;
              memset(bits->bits[1].name + lVar2 * 0x48,0,(long)(p___2 + (long)local_320) * 0x48);
              pcVar7 = (char *)__u_3;
            }
            __u_3 = (uint64_t)pcVar7;
            p___2 = (char *)0x0;
            do {
              if (_rc->length->exts == (lysp_ext_instance *)0x0) {
                local_330 = (lysp_ext_instance *)0x0;
              }
              else {
                local_330 = _rc->length->exts[-1].exts;
              }
              if (local_330 <= p___2) goto LAB_0016ea86;
              pcVar7 = bits->bits[1].name;
              *(long *)(pcVar7 + -8) = *(long *)(pcVar7 + -8) + 1;
              if (bits->bits[1].name == (char *)0x0) {
                local_350 = 0;
              }
              else {
                local_350 = *(long *)(bits->bits[1].name + -8);
              }
              bin._0_4_ = lys_compile_ext((lysc_ctx *)context_pnode_local,
                                          _rc->length->exts + (long)p___2,
                                          (lysc_ext_instance *)
                                          (bits->bits[1].name + (local_350 + -1) * 0x48),bits->bits)
              ;
              if ((LY_ERR)bin == LY_ENOT) {
                pcVar7 = bits->bits[1].name;
                *(long *)(pcVar7 + -8) = *(long *)(pcVar7 + -8) + -1;
                bin._0_4_ = LY_SUCCESS;
              }
              else if ((LY_ERR)bin != LY_SUCCESS) goto LAB_00170587;
              p___2 = p___2 + 1;
            } while( true );
          }
          ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).","lys_compile_type_");
          bin._0_4_ = LY_EMEM;
        }
        goto LAB_00170587;
      }
    }
LAB_0016ea86:
    if (_rc->patterns != (lysp_restr *)0x0) {
      if (base == (lysc_type *)0x0) {
        local_368 = (lysc_ext_instance *)0x0;
      }
      else {
        local_368 = base[1].exts;
      }
      bin._0_4_ = lys_compile_type_patterns
                            ((lysc_ctx *)context_pnode_local,_rc->patterns,
                             (lysc_pattern **)local_368,(lysc_pattern ***)(bits + 1));
      LVar4 = (LY_ERR)bin;
      goto joined_r0x0016f978;
    }
    if ((base != (lysc_type *)0x0) && (base[1].exts != (lysc_ext_instance *)0x0)) {
      pplVar9 = lysc_patterns_dup((ly_ctx *)context_pnode_local->parent,
                                  (lysc_pattern **)base[1].exts);
      bits[1].name = (char *)pplVar9;
    }
    break;
  case LY_TYPE_BITS:
    enumeration = (lysc_type_enum *)*type;
    if (_rc->bits == (lysp_type_enum *)0x0) {
      if (base == (lysc_type *)0x0) {
        if (tpdfname == (char *)0x0) {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Missing %s substatement for %s%s.","bit","bits type","");
        }
        else {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Missing %s substatement for %s%s.","bit","bits type ",tpdfname);
        }
        bin._0_4_ = LY_EVALID;
        goto LAB_00170587;
      }
      if (tpdf_chain->count <= tpdf_chain_last) {
        __assert_fail("tpdf_chain->count > tpdf_chain_last",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0x71e,
                      "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                     );
      }
      pcStack_90 = (char *)0x0;
      __u._4_4_ = tpdf_chain->count;
      do {
        __u._4_4_ = __u._4_4_ - 1;
        base_type_p = (lysp_type *)(tpdf_chain->field_2).dnodes[__u._4_4_];
        if (*(long *)(base_type_p->name + 0x68) != 0) {
          pcStack_90 = base_type_p->name + 0x40;
          break;
        }
      } while (tpdf_chain_last < __u._4_4_);
      if (pcStack_90 == (char *)0x0) {
        __assert_fail("base_type_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0x72a,
                      "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                     );
      }
      bin._0_4_ = lys_compile_type_enums
                            ((lysc_ctx *)context_pnode_local,*(lysp_type_enum **)(pcStack_90 + 0x28)
                             ,bin._4_4_,(lysc_type_bitenum_item *)0x0,&enumeration->enums);
      LVar4 = (LY_ERR)bin;
    }
    else {
      if (base == (lysc_type *)0x0) {
        local_200 = (lysc_type_bitenum_item *)0x0;
      }
      else {
        local_200 = (lysc_type_bitenum_item *)base[1].name;
      }
      bin._0_4_ = lys_compile_type_enums
                            ((lysc_ctx *)context_pnode_local,_rc->bits,bin._4_4_,local_200,
                             &enumeration->enums);
      LVar4 = (LY_ERR)bin;
    }
    goto joined_r0x0016f978;
  case LY_TYPE_DEC64:
    idref = (lysc_type_identityref *)*type;
    if (base == (lysc_type *)0x0) {
      if (_rc->fraction_digits == '\0') {
        if (tpdfname == (char *)0x0) {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Missing %s substatement for %s%s.","fraction-digits","decimal64 type","");
        }
        else {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Missing %s substatement for %s%s.","fraction-digits","decimal64 type ",tpdfname);
        }
        bin._0_4_ = LY_EVALID;
        goto LAB_00170587;
      }
      *(uint8_t *)&idref->bases = _rc->fraction_digits;
    }
    else {
      if (_rc->fraction_digits != '\0') {
        if (tpdfname == (char *)0x0) {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid fraction-digits substatement for type not directly derived from decimal64 built-in type."
                 );
        }
        else {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid fraction-digits substatement for type \"%s\" not directly derived from decimal64 built-in type."
                  ,tpdfname);
        }
        bin._0_4_ = LY_EVALID;
        goto LAB_00170587;
      }
      *(undefined1 *)&idref->bases = *(undefined1 *)&base[1].name;
    }
    if (_rc->range != (lysp_restr *)0x0) {
      if (base == (lysc_type *)0x0) {
        local_220 = (lysc_ext_instance *)0x0;
      }
      else {
        local_220 = base[1].exts;
      }
      bin._0_4_ = lys_compile_type_range
                            ((lysc_ctx *)context_pnode_local,_rc->range,bin._4_4_,'\0',
                             *(uint8_t *)&idref->bases,(lysc_range *)local_220,
                             (lysc_range **)(idref + 1));
      if ((LY_ERR)bin != LY_SUCCESS) goto LAB_00170587;
      if ((tpdfname == (char *)0x0) && (_rc->range->exts != (lysp_ext_instance *)0x0)) {
        if (*(long *)(idref[1].name + 0x28) == 0) {
          local_230 = (char *)0x0;
        }
        else {
          if (*(long *)(idref[1].name + 0x28) == 0) {
            local_228 = (char *)0x0;
          }
          else {
            local_228 = *(char **)(*(long *)(idref[1].name + 0x28) + -8);
          }
          local_230 = local_228;
        }
        p___1 = local_230;
        if (*(long *)(idref[1].name + 0x28) == 0) {
          if (_rc->range->exts == (lysp_ext_instance *)0x0) {
            local_260 = (lysp_ext_instance *)0x0;
          }
          else {
            local_260 = _rc->range->exts[-1].exts;
          }
          __u_2 = (uint64_t)calloc(1,(long)(local_230 + (long)local_260) * 0x48 + 8);
          if ((void *)__u_2 != (void *)0x0) goto LAB_0016e320;
          ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).","lys_compile_type_");
          bin._0_4_ = LY_EMEM;
        }
        else {
          if (_rc->range->exts == (lysp_ext_instance *)0x0) {
            local_250 = (lysp_ext_instance *)0x0;
          }
          else {
            local_250 = _rc->range->exts[-1].exts;
          }
          __u_2 = (uint64_t)
                  realloc((void *)(*(long *)(idref[1].name + 0x28) + -8),
                          (long)(local_230 + (long)local_250 +
                                *(long *)(*(long *)(idref[1].name + 0x28) + -8)) * 0x48 + 8);
          if ((void *)__u_2 != (void *)0x0) {
LAB_0016e320:
            uVar6 = __u_2 + 8;
            *(uint64_t *)(idref[1].name + 0x28) = uVar6;
            if (*(long *)(idref[1].name + 0x28) != 0) {
              lVar2 = *(long *)__u_2;
              if (_rc->range->exts == (lysp_ext_instance *)0x0) {
                local_278 = (lysp_ext_instance *)0x0;
              }
              else {
                local_278 = _rc->range->exts[-1].exts;
              }
              __u_2 = uVar6;
              memset((void *)(*(long *)(idref[1].name + 0x28) + lVar2 * 0x48),0,
                     (long)(p___1 + (long)local_278) * 0x48);
              uVar6 = __u_2;
            }
            __u_2 = uVar6;
            p___1 = (char *)0x0;
            do {
              if (_rc->range->exts == (lysp_ext_instance *)0x0) {
                local_288 = (lysp_ext_instance *)0x0;
              }
              else {
                local_288 = _rc->range->exts[-1].exts;
              }
              if (local_288 <= p___1) goto switchD_0016d80e_default;
              *(long *)(*(long *)(idref[1].name + 0x28) + -8) =
                   *(long *)(*(long *)(idref[1].name + 0x28) + -8) + 1;
              if (*(long *)(idref[1].name + 0x28) == 0) {
                local_2a8 = 0;
              }
              else {
                local_2a8 = *(long *)(*(long *)(idref[1].name + 0x28) + -8);
              }
              bin._0_4_ = lys_compile_ext((lysc_ctx *)context_pnode_local,
                                          _rc->range->exts + (long)p___1,
                                          (lysc_ext_instance *)
                                          (*(long *)(idref[1].name + 0x28) + (local_2a8 + -1) * 0x48
                                          ),idref[1].name);
              if ((LY_ERR)bin == LY_ENOT) {
                *(long *)(*(long *)(idref[1].name + 0x28) + -8) =
                     *(long *)(*(long *)(idref[1].name + 0x28) + -8) + -1;
                bin._0_4_ = LY_SUCCESS;
              }
              else if ((LY_ERR)bin != LY_SUCCESS) goto LAB_00170587;
              p___1 = p___1 + 1;
            } while( true );
          }
          ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).","lys_compile_type_");
          bin._0_4_ = LY_EMEM;
        }
        goto LAB_00170587;
      }
    }
    break;
  case LY_TYPE_ENUM:
    dec = (lysc_type_dec *)*type;
    if (_rc->enums == (lysp_type_enum *)0x0) {
      if (base == (lysc_type *)0x0) {
        if (tpdfname == (char *)0x0) {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Missing %s substatement for %s%s.","enum","enumeration type","");
        }
        else {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Missing %s substatement for %s%s.","enum","enumeration type ",tpdfname);
        }
        bin._0_4_ = LY_EVALID;
        goto LAB_00170587;
      }
      if (tpdf_chain->count <= tpdf_chain_last) {
        __assert_fail("tpdf_chain->count > tpdf_chain_last",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0x781,
                      "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                     );
      }
      pcStack_90 = (char *)0x0;
      __u._4_4_ = tpdf_chain->count;
      do {
        __u._4_4_ = __u._4_4_ - 1;
        base_type_p = (lysp_type *)(tpdf_chain->field_2).dnodes[__u._4_4_];
        if (*(long *)(base_type_p->name + 0x60) != 0) {
          pcStack_90 = base_type_p->name + 0x40;
          break;
        }
      } while (tpdf_chain_last < __u._4_4_);
      if (pcStack_90 == (char *)0x0) {
        __assert_fail("base_type_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0x78d,
                      "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                     );
      }
      bin._0_4_ = lys_compile_type_enums
                            ((lysc_ctx *)context_pnode_local,*(lysp_type_enum **)(pcStack_90 + 0x20)
                             ,bin._4_4_,(lysc_type_bitenum_item *)0x0,
                             (lysc_type_bitenum_item **)&dec->fraction_digits);
      LVar4 = (LY_ERR)bin;
    }
    else {
      if (base == (lysc_type *)0x0) {
        local_388 = (lysc_type_bitenum_item *)0x0;
      }
      else {
        local_388 = (lysc_type_bitenum_item *)base[1].name;
      }
      bin._0_4_ = lys_compile_type_enums
                            ((lysc_ctx *)context_pnode_local,_rc->enums,bin._4_4_,local_388,
                             (lysc_type_bitenum_item **)&dec->fraction_digits);
      LVar4 = (LY_ERR)bin;
    }
    goto joined_r0x0016f978;
  case LY_TYPE_IDENT:
    lref = (lysc_type_leafref *)*type;
    if (_rc->bases != (char **)0x0) {
      if (base != (lysc_type *)0x0) {
        if (tpdfname == (char *)0x0) {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid base substatement for the type not directly derived from identityref built-in type."
                 );
        }
        else {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid base substatement for the type \"%s\" not directly derived from identityref built-in type."
                  ,tpdfname);
        }
        bin._0_4_ = LY_EVALID;
        goto LAB_00170587;
      }
      bin._0_4_ = lys_compile_identity_bases
                            ((lysc_ctx *)context_pnode_local,_rc->pmod,_rc->bases,(lysc_ident *)0x0,
                             (lysc_ident ***)&lref->path);
      LVar4 = (LY_ERR)bin;
      goto joined_r0x0016f978;
    }
    if (base == (lysc_type *)0x0) {
      if (tpdfname == (char *)0x0) {
        ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                "Missing %s substatement for %s%s.","base","identityref type","");
      }
      else {
        ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                "Missing %s substatement for %s%s.","base","identityref type ",tpdfname);
      }
      bin._0_4_ = LY_EVALID;
      goto LAB_00170587;
    }
    u = (uint64_t)base;
    if (lref->path == (lyxp_expr *)0x0) {
      if (base[1].name == (char *)0x0) {
        local_450 = 0;
      }
      else {
        local_450 = *(long *)(base[1].name + -8);
      }
      plStack_f0 = (long *)calloc(1,local_450 * 8 + 8);
      if (plStack_f0 == (long *)0x0) {
        ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
               "Memory allocation failed (%s()).","lys_compile_type_");
        bin._0_4_ = LY_EMEM;
        goto LAB_00170587;
      }
    }
    else {
      if (base[1].name == (char *)0x0) {
        local_448 = 0;
      }
      else {
        local_448 = *(long *)(base[1].name + -8);
      }
      plStack_f0 = (long *)realloc(&lref->path[-1].expr,
                                   (long)(lref->path[-1].expr + local_448) * 8 + 8);
      if (plStack_f0 == (long *)0x0) {
        ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
               "Memory allocation failed (%s()).","lys_compile_type_");
        bin._0_4_ = LY_EMEM;
        goto LAB_00170587;
      }
    }
    plVar11 = plStack_f0 + 1;
    lref->path = (lyxp_expr *)plVar11;
    if (lref->path != (lyxp_expr *)0x0) {
      lVar2 = *plStack_f0;
      if (*(long *)(u + 0x20) == 0) {
        local_460 = 0;
      }
      else {
        local_460 = *(long *)(*(long *)(u + 0x20) + -8);
      }
      plStack_f0 = plVar11;
      memset(&lref->path->tokens + lVar2,0,local_460 << 3);
      plVar11 = plStack_f0;
    }
    plStack_f0 = plVar11;
    p___4 = (char *)0x0;
    while( true ) {
      if (*(long *)(u + 0x20) == 0) {
        local_470 = (char *)0x0;
      }
      else {
        local_470 = *(char **)(*(long *)(u + 0x20) + -8);
      }
      if (local_470 <= p___4) break;
      (&lref->path->tokens)[(long)p___4] = *(lyxp_token **)(*(long *)(u + 0x20) + (long)p___4 * 8);
      lref->path[-1].expr = lref->path[-1].expr + 1;
      p___4 = p___4 + 1;
    }
    break;
  case LY_TYPE_INST:
    if ((_rc->flags & 0x200) == 0) {
      *(undefined1 *)&(*type)[1].name = 1;
    }
    else {
      *(uint8_t *)&(*type)[1].name = _rc->require_instance;
    }
    break;
  case LY_TYPE_LEAFREF:
    un = (lysc_type_union *)*type;
    if ((_rc->flags & 0x200) == 0) {
      if (base == (lysc_type *)0x0) {
        *(undefined1 *)&un[1].plugin = LY_TYPE_BINARY;
      }
      else {
        *(char *)&un[1].plugin = (char)base[1].basetype;
      }
    }
    else {
      if (_rc->pmod->version < 2) {
        if (tpdfname == (char *)0x0) {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SEMANTICS,
                  "Leafref type can be restricted by require-instance statement only in YANG 1.1 modules."
                 );
        }
        else {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SEMANTICS,
                  "Leafref type \"%s\" can be restricted by require-instance statement only in YANG 1.1 modules."
                  ,tpdfname);
        }
        bin._0_4_ = LY_EVALID;
        goto LAB_00170587;
      }
      *(uint8_t *)&un[1].plugin = _rc->require_instance;
    }
    if (_rc->path == (lyxp_expr *)0x0) {
      if (base == (lysc_type *)0x0) {
        if (tpdfname == (char *)0x0) {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Missing %s substatement for %s%s.","path","leafref type","");
        }
        else {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Missing %s substatement for %s%s.","path","leafref type ",tpdfname);
        }
        bin._0_4_ = LY_EVALID;
        goto LAB_00170587;
      }
      bin._0_4_ = lyxp_expr_dup((ly_ctx *)context_pnode_local->parent,(lyxp_expr *)base[1].name,0,0,
                                (lyxp_expr **)&un->types);
      if ((LY_ERR)bin != LY_SUCCESS) goto LAB_00170587;
      bin._0_4_ = lyplg_type_prefix_data_dup
                            ((ly_ctx *)context_pnode_local->parent,LY_VALUE_SCHEMA_RESOLVED,
                             base[1].exts,&un[1].name);
      LVar4 = (LY_ERR)bin;
    }
    else {
      bin._0_4_ = lyxp_expr_dup((ly_ctx *)context_pnode_local->parent,_rc->path,0,0,
                                (lyxp_expr **)&un->types);
      if ((LY_ERR)bin != LY_SUCCESS) goto LAB_00170587;
      ctx_00 = (ly_ctx *)context_pnode_local->parent;
      pcVar7 = _rc->path->expr;
      value_len = strlen(_rc->path->expr);
      LVar4 = lyplg_type_prefix_data_new
                        (ctx_00,pcVar7,value_len,LY_VALUE_SCHEMA,_rc->pmod,
                         (LY_VALUE_FORMAT *)((long)&un_base + 4),&un[1].name);
    }
joined_r0x0016f978:
    if (LVar4 != LY_SUCCESS) goto LAB_00170587;
    break;
  case LY_TYPE_UNION:
    tpdf_item = (lys_type_item *)*type;
    if (_rc->types != (lysp_type *)0x0) {
      if (base != (lysc_type *)0x0) {
        if (tpdfname == (char *)0x0) {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid type substatement for the type not directly derived from union built-in type."
                 );
        }
        else {
          ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid type substatement for the type \"%s\" not directly derived from union built-in type."
                  ,tpdfname);
        }
        bin._0_4_ = LY_EVALID;
        goto LAB_00170587;
      }
      bin._0_4_ = lys_compile_type_union
                            ((lysc_ctx *)context_pnode_local,_rc->types,plStack_18,
                             context_name_local._6_2_,(char *)type_p_local,
                             (lysc_type ***)((long)tpdf_item + 0x20));
      LVar4 = (LY_ERR)bin;
      goto joined_r0x0016f978;
    }
    if (base == (lysc_type *)0x0) {
      if (tpdfname == (char *)0x0) {
        ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                "Missing %s substatement for %s%s.","type","union type","");
      }
      else {
        ly_vlog((ly_ctx *)context_pnode_local->parent,(char *)0x0,LYVE_SYNTAX_YANG,
                "Missing %s substatement for %s%s.","type","union type ",tpdfname);
      }
      bin._0_4_ = LY_EVALID;
      goto LAB_00170587;
    }
    if (((lysc_type *)((long)tpdf_item + 0x20))->name == (char *)0x0) {
      if (base[1].name == (char *)0x0) {
        local_4a0 = 0;
      }
      else {
        local_4a0 = *(long *)(base[1].name + -8);
      }
      __u_4 = (uint64_t)calloc(1,local_4a0 * 8 + 8);
      if ((void *)__u_4 == (void *)0x0) {
        ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
               "Memory allocation failed (%s()).","lys_compile_type_");
        bin._0_4_ = LY_EMEM;
        goto LAB_00170587;
      }
    }
    else {
      if (base[1].name == (char *)0x0) {
        local_498 = 0;
      }
      else {
        local_498 = *(long *)(base[1].name + -8);
      }
      __u_4 = (uint64_t)
              realloc(((lysc_type *)((long)tpdf_item + 0x20))->name + -8,
                      (*(long *)(((lysc_type *)((long)tpdf_item + 0x20))->name + -8) + local_498) *
                      8 + 8);
      if ((void *)__u_4 == (void *)0x0) {
        ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
               "Memory allocation failed (%s()).","lys_compile_type_");
        bin._0_4_ = LY_EMEM;
        goto LAB_00170587;
      }
    }
    tpdf_item[2].tpdf = (lysp_tpdf *)(__u_4 + 8);
    if (tpdf_item[2].tpdf != (lysp_tpdf *)0x0) {
      if (base[1].name == (char *)0x0) {
        local_4b0 = 0;
      }
      else {
        local_4b0 = *(long *)(base[1].name + -8);
      }
      memset(&(tpdf_item[2].tpdf)->name + *(long *)__u_4,0,local_4b0 << 3);
    }
    p___5 = (char *)0x0;
    while( true ) {
      if (base[1].name == (char *)0x0) {
        local_4c0 = (char *)0x0;
      }
      else {
        local_4c0 = *(char **)(base[1].name + -8);
      }
      if (local_4c0 <= p___5) break;
      (&(tpdf_item[2].tpdf)->name)[(long)p___5] = *(char **)(base[1].name + (long)p___5 * 8);
      LOCK();
      piVar1 = (int *)((&(tpdf_item[2].tpdf)->name)[(long)p___5] + 0x1c);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      *(long *)&tpdf_item[2].tpdf[-1].flags = *(long *)&tpdf_item[2].tpdf[-1].flags + 1;
      p___5 = p___5 + 1;
    }
  }
switchD_0016d80e_default:
  if (tpdf_chain_last < tpdf_chain->count) {
    __u._4_4_ = tpdf_chain->count;
    do {
      __u._4_4_ = __u._4_4_ - 1;
      base_type_p = (lysp_type *)(tpdf_chain->field_2).dnodes[__u._4_4_];
      if (*(long *)(base_type_p->name + 0x88) != 0) {
        if ((*type)->exts == (lysc_ext_instance *)0x0) {
          local_4d0 = (void *)0x0;
        }
        else {
          if ((*type)->exts == (lysc_ext_instance *)0x0) {
            local_4c8 = (void *)0x0;
          }
          else {
            local_4c8 = (*type)->exts[-1].compiled;
          }
          local_4d0 = local_4c8;
        }
        if ((*type)->exts == (lysc_ext_instance *)0x0) {
          if (*(long *)(base_type_p->name + 0x88) == 0) {
            local_500 = 0;
          }
          else {
            local_500 = *(long *)(*(long *)(base_type_p->name + 0x88) + -8);
          }
          __u_5 = (uint64_t)calloc(1,((long)local_4d0 + local_500) * 0x48 + 8);
          if ((void *)__u_5 == (void *)0x0) {
            ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
                   "Memory allocation failed (%s()).","lys_compile_type_");
            bin._0_4_ = LY_EMEM;
            goto LAB_00170587;
          }
        }
        else {
          if (*(long *)(base_type_p->name + 0x88) == 0) {
            local_4f0 = 0;
          }
          else {
            local_4f0 = *(long *)(*(long *)(base_type_p->name + 0x88) + -8);
          }
          __u_5 = (uint64_t)
                  realloc(&(*type)->exts[-1].compiled,
                          ((long)(*type)->exts[-1].compiled + (long)local_4d0 + local_4f0) * 0x48 +
                          8);
          if ((void *)__u_5 == (void *)0x0) {
            ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
                   "Memory allocation failed (%s()).","lys_compile_type_");
            bin._0_4_ = LY_EMEM;
            goto LAB_00170587;
          }
        }
        (*type)->exts = (lysc_ext_instance *)(__u_5 + 8);
        if ((*type)->exts != (lysc_ext_instance *)0x0) {
          if (*(long *)(base_type_p->name + 0x88) == 0) {
            local_518 = 0;
          }
          else {
            local_518 = *(long *)(*(long *)(base_type_p->name + 0x88) + -8);
          }
          memset((*type)->exts + *(long *)__u_5,0,((long)local_4d0 + local_518) * 0x48);
        }
        p___6 = (char *)0x0;
        while( true ) {
          if (*(long *)(base_type_p->name + 0x88) == 0) {
            local_528 = (char *)0x0;
          }
          else {
            local_528 = *(char **)(*(long *)(base_type_p->name + 0x88) + -8);
          }
          if (local_528 <= p___6) break;
          (*type)->exts[-1].compiled = (void *)((long)(*type)->exts[-1].compiled + 1);
          if ((*type)->exts == (lysc_ext_instance *)0x0) {
            local_548 = (void *)0x0;
          }
          else {
            local_548 = (*type)->exts[-1].compiled;
          }
          bin._0_4_ = lys_compile_ext((lysc_ctx *)context_pnode_local,
                                      (lysp_ext_instance *)
                                      (*(long *)(base_type_p->name + 0x88) + (long)p___6 * 0x70),
                                      (*type)->exts + (long)local_548 + -1,*type);
          if ((LY_ERR)bin == LY_ENOT) {
            (*type)->exts[-1].compiled = (void *)((long)(*type)->exts[-1].compiled + -1);
            bin._0_4_ = LY_SUCCESS;
          }
          else if ((LY_ERR)bin != LY_SUCCESS) goto LAB_00170587;
          p___6 = p___6 + 1;
        }
      }
    } while (tpdf_chain_last < __u._4_4_);
  }
  if (_rc->exts != (lysp_ext_instance *)0x0) {
    if ((*type)->exts == (lysc_ext_instance *)0x0) {
      local_558 = (void *)0x0;
    }
    else {
      if ((*type)->exts == (lysc_ext_instance *)0x0) {
        local_550 = (void *)0x0;
      }
      else {
        local_550 = (*type)->exts[-1].compiled;
      }
      local_558 = local_550;
    }
    if ((*type)->exts == (lysc_ext_instance *)0x0) {
      if (_rc->exts == (lysp_ext_instance *)0x0) {
        local_588 = (lysp_ext_instance *)0x0;
      }
      else {
        local_588 = _rc->exts[-1].exts;
      }
      local_130 = (long *)calloc(1,((long)local_558 + (long)local_588) * 0x48 + 8);
      if (local_130 == (long *)0x0) {
        ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
               "Memory allocation failed (%s()).","lys_compile_type_");
        bin._0_4_ = LY_EMEM;
        goto LAB_00170587;
      }
    }
    else {
      if (_rc->exts == (lysp_ext_instance *)0x0) {
        local_578 = (lysp_ext_instance *)0x0;
      }
      else {
        local_578 = _rc->exts[-1].exts;
      }
      local_130 = (long *)realloc(&(*type)->exts[-1].compiled,
                                  ((long)(*type)->exts[-1].compiled +
                                  (long)local_558 + (long)local_578) * 0x48 + 8);
      if (local_130 == (long *)0x0) {
        ly_log((ly_ctx *)context_pnode_local->parent,LY_LLERR,LY_EMEM,
               "Memory allocation failed (%s()).","lys_compile_type_");
        bin._0_4_ = LY_EMEM;
        goto LAB_00170587;
      }
    }
    (*type)->exts = (lysc_ext_instance *)(local_130 + 1);
    if ((*type)->exts != (lysc_ext_instance *)0x0) {
      if (_rc->exts == (lysp_ext_instance *)0x0) {
        local_5a0 = (lysp_ext_instance *)0x0;
      }
      else {
        local_5a0 = _rc->exts[-1].exts;
      }
      memset((*type)->exts + *local_130,0,((long)local_558 + (long)local_5a0) * 0x48);
    }
    p___7 = (char *)0x0;
    while( true ) {
      if (_rc->exts == (lysp_ext_instance *)0x0) {
        local_5b0 = (lysp_ext_instance *)0x0;
      }
      else {
        local_5b0 = _rc->exts[-1].exts;
      }
      if (local_5b0 <= p___7) break;
      (*type)->exts[-1].compiled = (void *)((long)(*type)->exts[-1].compiled + 1);
      if ((*type)->exts == (lysc_ext_instance *)0x0) {
        local_5d0 = (void *)0x0;
      }
      else {
        local_5d0 = (*type)->exts[-1].compiled;
      }
      bin._0_4_ = lys_compile_ext((lysc_ctx *)context_pnode_local,_rc->exts + (long)p___7,
                                  (*type)->exts + (long)local_5d0 + -1,*type);
      if ((LY_ERR)bin == LY_ENOT) {
        (*type)->exts[-1].compiled = (void *)((long)(*type)->exts[-1].compiled + -1);
        bin._0_4_ = LY_SUCCESS;
      }
      else if ((LY_ERR)bin != LY_SUCCESS) break;
      p___7 = p___7 + 1;
    }
  }
LAB_00170587:
  if ((LY_ERR)bin != LY_SUCCESS) {
    LOCK();
    (*type)->refcount = (*type)->refcount + 1;
    UNLOCK();
    lysc_type_free((lysf_ctx *)&context_pnode_local[2].next,*type);
    *type = (lysc_type *)0x0;
  }
  return (LY_ERR)bin;
}

Assistant:

static LY_ERR
lys_compile_type_(struct lysc_ctx *ctx, struct lysp_node *context_pnode, uint16_t context_flags, const char *context_name,
        const struct lysp_type *type_p, LY_DATA_TYPE basetype, const char *tpdfname, const struct lysc_type *base,
        struct lyplg_type *plugin, struct ly_set *tpdf_chain, uint32_t tpdf_chain_last, struct lysc_type **type)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysc_type_bin *bin;
    struct lysc_type_num *num;
    struct lysc_type_str *str;
    struct lysc_type_bits *bits;
    struct lysc_type_enum *enumeration;
    struct lysc_type_dec *dec;
    struct lysc_type_identityref *idref;
    struct lysc_type_leafref *lref;
    struct lysc_type_union *un;
    struct lys_type_item *tpdf_item;
    const struct lysp_type *base_type_p;
    uint32_t i;

    /* alloc and init */
    rc = lys_new_type(ctx->ctx, basetype, tpdfname, type);
    LY_CHECK_GOTO(rc, cleanup);

    (*type)->basetype = basetype;
    (*type)->plugin = plugin;

    switch (basetype) {
    case LY_TYPE_BINARY:
        bin = (struct lysc_type_bin *)*type;

        /* RFC 7950 9.8.1, 9.4.4 - length, number of octets it contains */
        if (type_p->length) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->length, basetype, 1, 0,
                    base ? ((struct lysc_type_bin *)base)->length : NULL, &bin->length), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->length->exts, bin->length->exts, bin->length, rc, cleanup);
            }
        }
        break;
    case LY_TYPE_BITS:
        /* RFC 7950 9.7 - bits */
        bits = (struct lysc_type_bits *)*type;
        if (type_p->bits) {
            /* compile bits from this type */
            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, type_p->bits, basetype,
                    base ? (struct lysc_type_bitenum_item *)((struct lysc_type_bits *)base)->bits : NULL,
                    (struct lysc_type_bitenum_item **)&bits->bits), cleanup);
        } else if (base) {
            /* recompile bits from the first superior type with bits */
            assert(tpdf_chain->count > tpdf_chain_last);
            base_type_p = NULL;
            i = tpdf_chain->count;
            do {
                --i;
                tpdf_item = tpdf_chain->objs[i];

                if (tpdf_item->tpdf->type.bits) {
                    base_type_p = &tpdf_item->tpdf->type;
                    break;
                }
            } while (i > tpdf_chain_last);
            assert(base_type_p);

            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, base_type_p->bits, basetype, NULL,
                    (struct lysc_type_bitenum_item **)&bits->bits), cleanup);
        } else {
            /* type derived from bits built-in type must contain at least one bit */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "bit", "bits type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "bit", "bits type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_DEC64:
        dec = (struct lysc_type_dec *)*type;

        /* RFC 7950 9.3.4 - fraction-digits */
        if (!base) {
            if (!type_p->fraction_digits) {
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "fraction-digits", "decimal64 type ", tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "fraction-digits", "decimal64 type", "");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            dec->fraction_digits = type_p->fraction_digits;
        } else {
            if (type_p->fraction_digits) {
                /* fraction digits is prohibited in types not directly derived from built-in decimal64 */
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid fraction-digits substatement for type \"%s\" not directly derived from decimal64 built-in type.",
                            tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid fraction-digits substatement for type not directly derived from decimal64 built-in type.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            dec->fraction_digits = ((struct lysc_type_dec *)base)->fraction_digits;
        }

        /* RFC 7950 9.2.4 - range */
        if (type_p->range) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->range, basetype, 0, dec->fraction_digits,
                    base ? ((struct lysc_type_dec *)base)->range : NULL, &dec->range), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->range->exts, dec->range->exts, dec->range, rc, cleanup);
            }
        }
        break;
    case LY_TYPE_STRING:
        str = (struct lysc_type_str *)*type;

        /* RFC 7950 9.4.4 - length */
        if (type_p->length) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->length, basetype, 1, 0,
                    base ? ((struct lysc_type_str *)base)->length : NULL, &str->length), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->length->exts, str->length->exts, str->length, rc, cleanup);
            }
        } else if (base && ((struct lysc_type_str *)base)->length) {
            str->length = lysc_range_dup(ctx, ((struct lysc_type_str *)base)->length, tpdf_chain, tpdf_chain_last);
        }

        /* RFC 7950 9.4.5 - pattern */
        if (type_p->patterns) {
            LY_CHECK_GOTO(rc = lys_compile_type_patterns(ctx, type_p->patterns,
                    base ? ((struct lysc_type_str *)base)->patterns : NULL, &str->patterns), cleanup);
        } else if (base && ((struct lysc_type_str *)base)->patterns) {
            str->patterns = lysc_patterns_dup(ctx->ctx, ((struct lysc_type_str *)base)->patterns);
        }
        break;
    case LY_TYPE_ENUM:
        enumeration = (struct lysc_type_enum *)*type;

        /* RFC 7950 9.6 - enum */
        if (type_p->enums) {
            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, type_p->enums, basetype,
                    base ? ((struct lysc_type_enum *)base)->enums : NULL, &enumeration->enums), cleanup);
        } else if (base) {
            /* recompile enums from the first superior type with enums */
            assert(tpdf_chain->count > tpdf_chain_last);
            base_type_p = NULL;
            i = tpdf_chain->count;
            do {
                --i;
                tpdf_item = tpdf_chain->objs[i];

                if (tpdf_item->tpdf->type.enums) {
                    base_type_p = &tpdf_item->tpdf->type;
                    break;
                }
            } while (i > tpdf_chain_last);
            assert(base_type_p);

            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, base_type_p->enums, basetype, NULL, &enumeration->enums), cleanup);
        } else {
            /* type derived from enumerations built-in type must contain at least one enum */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "enum", "enumeration type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "enum", "enumeration type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_INT8:
    case LY_TYPE_UINT8:
    case LY_TYPE_INT16:
    case LY_TYPE_UINT16:
    case LY_TYPE_INT32:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
        num = (struct lysc_type_num *)*type;

        /* RFC 6020 9.2.4 - range */
        if (type_p->range) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->range, basetype, 0, 0,
                    base ? ((struct lysc_type_num *)base)->range : NULL, &num->range), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->range->exts, num->range->exts, num->range, rc, cleanup);
            }
        }
        break;
    case LY_TYPE_IDENT:
        idref = (struct lysc_type_identityref *)*type;

        /* RFC 7950 9.10.2 - base */
        if (type_p->bases) {
            if (base) {
                /* only the directly derived identityrefs can contain base specification */
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid base substatement for the type \"%s\" not directly derived from identityref built-in type.",
                            tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid base substatement for the type not directly derived from identityref built-in type.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            LY_CHECK_GOTO(rc = lys_compile_identity_bases(ctx, type_p->pmod, type_p->bases, NULL, &idref->bases), cleanup);
        } else if (base) {
            /* copy all the bases */
            const struct lysc_type_identityref *idref_base = (struct lysc_type_identityref *)base;
            LY_ARRAY_COUNT_TYPE u;

            LY_ARRAY_CREATE_GOTO(ctx->ctx, idref->bases, LY_ARRAY_COUNT(idref_base->bases), rc, cleanup);
            LY_ARRAY_FOR(idref_base->bases, u) {
                idref->bases[u] = idref_base->bases[u];
                LY_ARRAY_INCREMENT(idref->bases);
            }
        } else {
            /* type derived from identityref built-in type must contain at least one base */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "base", "identityref type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "base", "identityref type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_LEAFREF:
        lref = (struct lysc_type_leafref *)*type;

        /* RFC 7950 9.9.3 - require-instance */
        if (type_p->flags & LYS_SET_REQINST) {
            if (type_p->pmod->version < LYS_VERSION_1_1) {
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                            "Leafref type \"%s\" can be restricted by require-instance statement only in YANG 1.1 modules.", tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                            "Leafref type can be restricted by require-instance statement only in YANG 1.1 modules.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            lref->require_instance = type_p->require_instance;
        } else if (base) {
            /* inherit */
            lref->require_instance = ((struct lysc_type_leafref *)base)->require_instance;
        } else {
            /* default is true */
            lref->require_instance = 1;
        }
        if (type_p->path) {
            LY_VALUE_FORMAT format;

            LY_CHECK_GOTO(rc = lyxp_expr_dup(ctx->ctx, type_p->path, 0, 0, &lref->path), cleanup);
            LY_CHECK_GOTO(lyplg_type_prefix_data_new(ctx->ctx, type_p->path->expr, strlen(type_p->path->expr),
                    LY_VALUE_SCHEMA, type_p->pmod, &format, (void **)&lref->prefixes), cleanup);
        } else if (base) {
            LY_CHECK_GOTO(rc = lyxp_expr_dup(ctx->ctx, ((struct lysc_type_leafref *)base)->path, 0, 0, &lref->path), cleanup);
            LY_CHECK_GOTO(rc = lyplg_type_prefix_data_dup(ctx->ctx, LY_VALUE_SCHEMA_RESOLVED,
                    ((struct lysc_type_leafref *)base)->prefixes, (void **)&lref->prefixes), cleanup);
        } else {
            /* type derived from leafref built-in type must contain path */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "path", "leafref type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "path", "leafref type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_INST:
        /* RFC 7950 9.9.3 - require-instance */
        if (type_p->flags & LYS_SET_REQINST) {
            ((struct lysc_type_instanceid *)*type)->require_instance = type_p->require_instance;
        } else {
            /* default is true */
            ((struct lysc_type_instanceid *)*type)->require_instance = 1;
        }
        break;
    case LY_TYPE_UNION:
        un = (struct lysc_type_union *)*type;

        /* RFC 7950 7.4 - type */
        if (type_p->types) {
            if (base) {
                /* only the directly derived union can contain types specification */
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid type substatement for the type \"%s\" not directly derived from union built-in type.",
                            tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid type substatement for the type not directly derived from union built-in type.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            /* compile the type */
            LY_CHECK_GOTO(rc = lys_compile_type_union(ctx, type_p->types, context_pnode, context_flags, context_name,
                    &un->types), cleanup);
        } else if (base) {
            /* copy all the types */
            const struct lysc_type_union *un_base = (struct lysc_type_union *)base;
            LY_ARRAY_COUNT_TYPE u;

            LY_ARRAY_CREATE_GOTO(ctx->ctx, un->types, LY_ARRAY_COUNT(un_base->types), rc, cleanup);
            LY_ARRAY_FOR(un_base->types, u) {
                un->types[u] = un_base->types[u];
                LY_ATOMIC_INC_BARRIER(un->types[u]->refcount);
                LY_ARRAY_INCREMENT(un->types);
            }
        } else {
            /* type derived from union built-in type must contain at least one type */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "type", "union type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "type", "union type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_BOOL:
    case LY_TYPE_EMPTY:
    case LY_TYPE_UNKNOWN: /* just to complete switch */
        break;
    }

    if (tpdf_chain->count > tpdf_chain_last) {
        i = tpdf_chain->count;
        do {
            --i;
            tpdf_item = tpdf_chain->objs[i];

            /* compile previous typedefs extensions */
            COMPILE_EXTS_GOTO(ctx, tpdf_item->tpdf->type.exts, (*type)->exts, *type, rc, cleanup);
        } while (i > tpdf_chain_last);
    }

    /* compile new parsed extensions */
    COMPILE_EXTS_GOTO(ctx, type_p->exts, (*type)->exts, *type, rc, cleanup);

cleanup:
    if (rc) {
        LY_ATOMIC_INC_BARRIER((*type)->refcount);
        lysc_type_free(&ctx->free_ctx, *type);
        *type = NULL;
    }
    return rc;
}